

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  FileType FVar4;
  uint64_t num;
  Slice rest;
  uint64_t local_28;
  Slice local_20;
  
  local_20.data_ = (filename->_M_dataplus)._M_p;
  local_20.size_ = filename->_M_string_length;
  if (local_20.size_ == 3) {
    pcVar1 = "/LOG";
LAB_00111101:
    iVar3 = bcmp(local_20.data_,pcVar1 + 1,local_20.size_);
    if (iVar3 == 0) {
      *number = 0;
      *type = kInfoLogFile;
      return true;
    }
  }
  else if (local_20.size_ == 4) {
    iVar3 = bcmp(local_20.data_,"LOCK",4);
    if (iVar3 == 0) {
      *number = 0;
      *type = kDBLockFile;
      return true;
    }
  }
  else {
    if (local_20.size_ == 7) {
      if (*(int *)((long)local_20.data_ + 3) == 0x544e4552 &&
          (int)*(long *)local_20.data_ == 0x52525543) {
        *number = 0;
        *type = kCurrentFile;
        return true;
      }
      pcVar1 = "/LOG.old";
      goto LAB_00111101;
    }
    if ((8 < local_20.size_) &&
       ((char)*(long *)((long)local_20.data_ + 8) == '-' &&
        *(long *)local_20.data_ == 0x54534546494e414d)) {
      local_20.data_ = (char *)((long)local_20.data_ + 9);
      local_20.size_ = local_20.size_ - 9;
      bVar2 = ConsumeDecimalNumber(&local_20,&local_28);
      if (!bVar2) {
        return false;
      }
      if (local_20.size_ != 0) {
        return false;
      }
      *type = kDescriptorFile;
      goto LAB_001111e7;
    }
  }
  bVar2 = ConsumeDecimalNumber(&local_20,&local_28);
  if (!bVar2) {
    return false;
  }
  if (local_20.size_ == 6) {
    iVar3 = bcmp(local_20.data_,".dbtmp",6);
    if (iVar3 != 0) {
      return false;
    }
    FVar4 = kTempFile;
  }
  else {
    if (local_20.size_ != 4) {
      return false;
    }
    if (*(int *)local_20.data_ == 0x676f6c2e) {
      FVar4 = kLogFile;
    }
    else {
      FVar4 = kTableFile;
      if ((*(int *)local_20.data_ != 0x7473732e) && (*(int *)local_20.data_ != 0x62646c2e)) {
        return false;
      }
    }
  }
  *type = FVar4;
LAB_001111e7:
  *number = local_28;
  return true;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}